

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult *
Catch::clara::detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  bool bVar6;
  long lVar7;
  string srcLC;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90 = local_80;
  pcVar1 = (source->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + source->_M_string_length);
  puVar2 = local_90;
  if (local_88 != 0) {
    lVar7 = 0;
    do {
      iVar3 = tolower((uint)(byte)puVar2[lVar7]);
      puVar2[lVar7] = (char)iVar3;
      lVar7 = lVar7 + 1;
    } while (local_88 != lVar7);
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
  bVar6 = true;
  if (iVar3 != 0) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 != 0) {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
      if (iVar3 != 0) {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
        if (iVar3 != 0) {
          iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
          if (iVar3 != 0) {
            iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
            if (iVar3 != 0) {
              iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
              if (iVar3 != 0) {
                iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
                if (iVar3 != 0) {
                  iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
                  if (iVar3 != 0) {
                    iVar3 = ::std::__cxx11::string::compare((char *)&local_90);
                    if (iVar3 != 0) {
                      ::std::operator+(&local_50,
                                       "Expected a boolean value but did not recognise: \'",source);
                      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_50);
                      plVar5 = plVar4 + 2;
                      if ((long *)*plVar4 == plVar5) {
                        local_60 = *plVar5;
                        uStack_58 = (undefined4)plVar4[3];
                        uStack_54 = *(undefined4 *)((long)plVar4 + 0x1c);
                        local_70 = &local_60;
                      }
                      else {
                        local_60 = *plVar5;
                        local_70 = (long *)*plVar4;
                      }
                      local_68 = plVar4[1];
                      *plVar4 = (long)plVar5;
                      plVar4[1] = 0;
                      *(undefined1 *)(plVar4 + 2) = 0;
                      (__return_storage_ptr__->
                      super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase
                      .m_type = RuntimeError;
                      (__return_storage_ptr__->
                      super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase
                      ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cd478;
                      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
                           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)&__return_storage_ptr__->m_errorMessage,local_70,
                                 local_68 + (long)local_70);
                      if (local_70 != &local_60) {
                        operator_delete(local_70);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p);
                      }
                      goto LAB_0018da1f;
                    }
                  }
                }
              }
            }
            bVar6 = false;
          }
        }
      }
    }
  }
  *target = bVar6;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cd478;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0018da1f:
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, bool &target ) -> ParserResult {
        std::string srcLC = source;
        std::transform( srcLC.begin(), srcLC.end(), srcLC.begin(), []( unsigned char c ) { return static_cast<char>( std::tolower(c) ); } );
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
            target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
            target = false;
        else
            return ParserResult::runtimeError( "Expected a boolean value but did not recognise: '" + source + "'" );
        return ParserResult::ok( ParseResultType::Matched );
    }